

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<TestCountExpr>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,TestCountExpr>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
                *matchers,tuple<mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr> *values,ostream *os
               )

{
  Kind KVar1;
  MatcherInterface<mp::expr::Kind> *pMVar2;
  char cVar3;
  ostream *poVar4;
  BiggestInt kBigInt;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<mp::expr::Kind> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)&MStack_1e8,
             &(matchers->
              super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
              ).super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl);
  KVar1 = (values->super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr>).
          super__Head_base<0UL,_mp::expr::Kind,_false>._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  cVar3 = (**(code **)(*(long *)MStack_1e8.impl_.value_ + 0x20))
                    (MStack_1e8.impl_.value_,KVar1,&local_1b0);
  if (cVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
             ).super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
             super_MatcherBase<mp::expr::Kind>.impl_.value_;
    (**(code **)(*(long *)pMVar2 + 0x10))(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    std::ostream::_M_insert<long_long>((longlong)os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<mp::expr::Kind>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }